

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Cues::PreloadCuePoint(Cues *this,long *cue_points_size,longlong pos)

{
  long lVar1;
  CuePoint **ppCVar2;
  CuePoint **ppCVar3;
  long lVar4;
  CuePoint *this_00;
  ulong uVar5;
  
  if (this->m_count == 0) {
    lVar1 = this->m_preload_count;
    lVar4 = *cue_points_size;
    if (lVar4 <= lVar1) {
      uVar5 = 0x800;
      if (0 < lVar4) {
        uVar5 = lVar4 * 2;
      }
      ppCVar3 = (CuePoint **)
                operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8,(nothrow_t *)&std::nothrow);
      if (ppCVar3 == (CuePoint **)0x0) {
        return false;
      }
      ppCVar2 = this->m_cue_points;
      if (lVar1 != 0) {
        lVar4 = 0;
        do {
          *(undefined8 *)((long)ppCVar3 + lVar4) = *(undefined8 *)((long)ppCVar2 + lVar4);
          lVar4 = lVar4 + 8;
        } while (lVar1 << 3 != lVar4);
      }
      if (ppCVar2 != (CuePoint **)0x0) {
        operator_delete__(ppCVar2);
      }
      this->m_cue_points = ppCVar3;
      *cue_points_size = uVar5;
    }
    this_00 = (CuePoint *)operator_new(0x30,(nothrow_t *)&std::nothrow);
    if (this_00 != (CuePoint *)0x0) {
      CuePoint::CuePoint(this_00,this->m_preload_count,pos);
      lVar1 = this->m_preload_count;
      this->m_preload_count = lVar1 + 1;
      this->m_cue_points[lVar1] = this_00;
      return true;
    }
  }
  return false;
}

Assistant:

bool Cues::PreloadCuePoint(long& cue_points_size, long long pos) const {
  if (m_count != 0)
    return false;

  if (m_preload_count >= cue_points_size) {
    const long n = (cue_points_size <= 0) ? 2048 : 2 * cue_points_size;

    CuePoint** const qq = new (std::nothrow) CuePoint*[n];
    if (qq == NULL)
      return false;

    CuePoint** q = qq;  // beginning of target

    CuePoint** p = m_cue_points;  // beginning of source
    CuePoint** const pp = p + m_preload_count;  // end of source

    while (p != pp)
      *q++ = *p++;

    delete[] m_cue_points;

    m_cue_points = qq;
    cue_points_size = n;
  }

  CuePoint* const pCP = new (std::nothrow) CuePoint(m_preload_count, pos);
  if (pCP == NULL)
    return false;

  m_cue_points[m_preload_count++] = pCP;
  return true;
}